

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitNot
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,NotExpr e)

{
  ExprBase e_00;
  
  fmt::BasicWriter<char>::operator<<(this->writer_,'!');
  e_00.impl_ = ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49>.super_ExprBase.impl_
               + 8))->impl_;
  Visit(this,(LogicalExpr)e_00.impl_,
        (uint)(expr::PrecInfo::INFO[(e_00.impl_)->kind_] == RELATIONAL) * 9 + -1);
  return;
}

Assistant:

void VisitNot(NotExpr e) {
     writer_ << '!';
     // Use a precedence higher then relational to print expressions
     // as "!(x = y)" instead of "!x = y".
     LogicalExpr arg = e.arg();
     Visit(arg,
           precedence(arg) == prec::RELATIONAL ? prec::RELATIONAL + 1 : -1);
  }